

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::bt_peer_connection
          (bt_peer_connection *this,peer_connection_args *pack)

{
  undefined8 uVar1;
  value_type local_25 [13];
  peer_connection_args *local_18;
  peer_connection_args *pack_local;
  bt_peer_connection *this_local;
  
  local_18 = pack;
  pack_local = (peer_connection_args *)this;
  peer_connection::peer_connection(&this->super_peer_connection,pack);
  (this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket =
       (_func_int **)&PTR_assign_bandwidth_00b8b3e0;
  (this->super_peer_connection).super_disk_observer._vptr_disk_observer =
       (_func_int **)&DAT_00b8b598;
  (this->super_peer_connection).super_peer_connection_interface._vptr_peer_connection_interface =
       (_func_int **)&PTR_destination_abi_cxx11__00b8b5b0;
  (this->super_peer_connection).field_0x888 = 7;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0xfe;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0xfd;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0xfb;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0xf7;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0xef;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0xdf;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0xbf;
  (this->super_peer_connection).field_0x889 = (this->super_peer_connection).field_0x889 & 0x7f;
  crypto_receive_buffer::crypto_receive_buffer
            (&this->m_recv_buffer,&(this->super_peer_connection).m_recv_buffer);
  ::std::__cxx11::string::string((string *)&this->m_client_version);
  (this->m_our_peer_id).m_number._M_elems[4] = (local_18->our_peer_id).m_number._M_elems[4];
  uVar1 = *(undefined8 *)((local_18->our_peer_id).m_number._M_elems + 2);
  *(undefined8 *)(this->m_our_peer_id).m_number._M_elems =
       *(undefined8 *)(local_18->our_peer_id).m_number._M_elems;
  *(undefined8 *)((this->m_our_peer_id).m_number._M_elems + 2) = uVar1;
  ::std::
  vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
  ::vector(&this->m_payloads);
  ::std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>::
  vector(&this->m_hash_requests);
  ::std::
  unique_ptr<libtorrent::aux::dh_key_exchange,std::default_delete<libtorrent::aux::dh_key_exchange>>
  ::unique_ptr<std::default_delete<libtorrent::aux::dh_key_exchange>,void>
            ((unique_ptr<libtorrent::aux::dh_key_exchange,std::default_delete<libtorrent::aux::dh_key_exchange>>
              *)&this->m_dh_key_exchange);
  ::std::shared_ptr<libtorrent::aux::rc4_handler>::shared_ptr(&this->m_rc4);
  encryption_handler::encryption_handler(&this->m_enc_handler);
  ::std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<std::default_delete<char[]>,void>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&this->m_sync_vc);
  ::std::unique_ptr<libtorrent::digest32<160l>,std::default_delete<libtorrent::digest32<160l>>>::
  unique_ptr<std::default_delete<libtorrent::digest32<160l>>,void>
            ((unique_ptr<libtorrent::digest32<160l>,std::default_delete<libtorrent::digest32<160l>>>
              *)&this->m_sync_hash);
  this->m_sync_bytes_read = 0;
  this->m_upload_only_id = '\0';
  this->m_holepunch_id = '\0';
  this->m_dont_have_id = '\0';
  this->m_share_mode_id = '\0';
  ::std::weak_ptr<libtorrent::aux::ut_pex_peer_store>::weak_ptr(&this->m_ut_pex);
  peer_connection::peer_log(&this->super_peer_connection,info,"CONSTRUCT","bt_peer_connection");
  local_25[0] = '\0';
  ::std::array<char,_8UL>::fill(&this->m_reserved_bits,local_25);
  return;
}

Assistant:

bt_peer_connection::bt_peer_connection(peer_connection_args& pack)
		: peer_connection(pack)
		, m_supports_extensions(false)
		, m_supports_dht_port(false)
		, m_supports_fast(false)
		, m_sent_bitfield(false)
		, m_sent_handshake(false)
		, m_sent_allowed_fast(false)
#if !defined TORRENT_DISABLE_ENCRYPTION
		, m_encrypted(false)
		, m_rc4_encrypted(false)
		, m_recv_buffer(peer_connection::m_recv_buffer)
#endif
		, m_our_peer_id(pack.our_peer_id)
	{
#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "CONSTRUCT", "bt_peer_connection");
#endif

		m_reserved_bits.fill(0);
	}